

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O0

string * __thiscall OpenMD::Bond::getName_abi_cxx11_(Bond *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x78));
  return in_RDI;
}

Assistant:

virtual std::string getName() { return name_; }